

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall CTB<UF>::PerformLabeling(CTB<UF> *this)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  undefined4 uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar3,piVar3[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar9 = (uint *)operator_new__((ulong)((((int)((ulong)*(undefined8 *)&pMVar4->field_0x8 >> 0x20)
                                           + 1) / 2) *
                                          (((int)*(undefined8 *)&pMVar4->field_0x8 + 1) / 2) + 1) <<
                                  2);
  UF::P_ = puVar9;
  *puVar9 = 0;
  UF::length_ = 1;
  uVar19 = (ulong)*(int *)&pMVar4->field_0x8;
  uVar18 = 1;
  if (0 < (long)uVar19) {
    uVar18 = *(uint *)&pMVar4->field_0xc;
    lVar10 = (long)(int)uVar18;
    uVar14 = 0;
    do {
      if (0 < (int)uVar18) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar28 = **(long **)&pMVar4->field_0x48;
        lVar26 = lVar28 * uVar14 + *(long *)&pMVar4->field_0x10;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar24 = lVar26 - lVar28;
        lVar28 = lVar28 + lVar26;
        lVar6 = *(long *)&pMVar5->field_0x10;
        lVar7 = **(long **)&pMVar5->field_0x48;
        lVar1 = lVar6 + lVar7 * uVar14;
        lVar22 = lVar1 - lVar7;
        lVar20 = lVar1 + lVar7;
        lVar11 = lVar7 + lVar1 + -4;
        uVar23 = uVar14 | 1;
        uVar21 = 0xffffffff;
        uVar13 = 0;
        iVar16 = -1;
        do {
          switch(uVar21) {
          case 1:
            if (*(char *)(lVar26 + uVar13) != '\0') {
              if (uVar14 == 0) {
LAB_001ab100:
                UF::P_[UF::length_] = UF::length_;
                uVar27 = UF::length_ + 1;
                *(uint *)(lVar1 + uVar13 * 4) = UF::length_;
                UF::length_ = uVar27;
LAB_001ab11b:
                iVar16 = 6;
              }
              else if (*(char *)(lVar24 + uVar13) == '\0') {
                if ((lVar10 <= (long)(uVar13 + 1)) || (*(char *)(lVar24 + uVar13 + 1) == '\0')) {
                  if ((uVar13 == 0) || (*(char *)((uVar13 - 1) + lVar24) == '\0'))
                  goto LAB_001ab100;
                  *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar22 + -4 + uVar13 * 4);
                  goto LAB_001ab11b;
                }
                uVar27 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                iVar16 = 5;
                if ((uVar13 != 0) && (*(char *)((uVar13 - 1) + lVar24) != '\0')) {
                  do {
                    uVar17 = uVar27;
                    uVar27 = UF::P_[uVar17];
                    uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
                  } while (UF::P_[uVar17] < uVar17);
                  do {
                    uVar27 = uVar8;
                    uVar8 = UF::P_[uVar27];
                  } while (UF::P_[uVar27] < uVar27);
                  if (uVar17 < uVar27) {
                    UF::P_[uVar27] = uVar17;
                  }
                  else {
                    UF::P_[uVar17] = uVar27;
                  }
                }
              }
              else {
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar22 + uVar13 * 4);
                iVar16 = 4;
              }
              uVar21 = 2;
              goto LAB_001ab2ab;
            }
            uVar21 = 1;
            if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
              UF::P_[UF::length_] = UF::length_;
              uVar27 = UF::length_ + 1;
              *(uint *)(lVar20 + uVar13 * 4) = UF::length_;
              UF::length_ = uVar27;
              uVar21 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar26 + uVar13) != '\0') {
              uVar21 = 2;
              if (iVar16 == 6) {
                uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                iVar16 = 6;
                if (((uVar14 != 0) && ((long)(uVar13 + 1) < lVar10)) &&
                   (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                  do {
                    uVar17 = uVar27;
                    uVar15 = (ulong)uVar17;
                    uVar27 = UF::P_[uVar15];
                    uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                  } while (UF::P_[uVar15] < uVar17);
                  do {
                    uVar27 = uVar8;
                    uVar25 = (ulong)uVar27;
                    uVar8 = UF::P_[uVar25];
                  } while (UF::P_[uVar25] < uVar27);
LAB_001aaecf:
                  if (uVar17 < uVar27) {
LAB_001ab28d:
                    UF::P_[uVar25] = uVar17;
                  }
                  else {
                    UF::P_[uVar15] = uVar27;
                  }
LAB_001ab291:
                  iVar16 = 5;
                }
              }
              else if (iVar16 == 5) {
LAB_001aac88:
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar1 + -4 + uVar13 * 4);
                iVar16 = 5;
                uVar21 = 5;
              }
              else if (iVar16 == 4) {
                uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                iVar16 = 6;
                if (uVar14 != 0) {
                  if (*(char *)(lVar24 + uVar13) == '\0') {
                    if (((long)(uVar13 + 1) < lVar10) && (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                      do {
                        uVar17 = uVar27;
                        uVar15 = (ulong)uVar17;
                        uVar27 = UF::P_[uVar15];
                        uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                      } while (UF::P_[uVar15] < uVar17);
                      do {
                        uVar27 = uVar8;
                        uVar25 = (ulong)uVar27;
                        uVar8 = UF::P_[uVar25];
                      } while (UF::P_[uVar25] < uVar27);
LAB_001ab284:
                      uVar21 = 4;
                      if (uVar17 < uVar27) goto LAB_001ab28d;
                      UF::P_[uVar15] = uVar27;
                      goto LAB_001ab291;
                    }
                  }
                  else {
LAB_001aac30:
                    iVar16 = 4;
                  }
                }
LAB_001aac35:
                uVar21 = 4;
              }
              goto LAB_001ab2ab;
            }
LAB_001aac41:
            uVar21 = 1;
            if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
              *(undefined4 *)(lVar20 + uVar13 * 4) =
                   *(undefined4 *)(lVar6 + lVar7 * uVar14 + -4 + uVar13 * 4);
              goto LAB_001aac67;
            }
            break;
          case 3:
            if (*(char *)(lVar26 + uVar13) != '\0') {
              if (uVar14 == 0) {
LAB_001aac72:
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar11 + uVar13 * 4);
                iVar16 = 6;
              }
              else if (*(char *)(lVar24 + uVar13) == '\0') {
                if (((long)(uVar13 + 1) < lVar10) && (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                  uVar27 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                  puVar9 = UF::P_;
                  do {
                    uVar17 = uVar27;
                    uVar27 = UF::P_[uVar17];
                    uVar8 = *(uint *)(lVar20 + -4 + uVar13 * 4);
                  } while (UF::P_[uVar17] < uVar17);
                  do {
                    uVar27 = uVar8;
                    uVar8 = UF::P_[uVar27];
                  } while (UF::P_[uVar27] < uVar27);
                  if (uVar17 < uVar27) {
                    UF::P_[uVar27] = uVar17;
                  }
                  else {
                    UF::P_[uVar17] = uVar27;
                  }
                  iVar16 = 5;
                  if ((uVar13 != 0) && (*(char *)(lVar24 + -1 + uVar13) != '\0')) {
                    uVar27 = *(uint *)(lVar1 + uVar13 * 4);
                    do {
                      uVar17 = uVar27;
                      uVar15 = (ulong)uVar17;
                      uVar27 = puVar9[uVar15];
                      uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
                    } while (puVar9[uVar15] < uVar17);
                    do {
                      uVar27 = uVar8;
                      uVar25 = (ulong)uVar27;
                      uVar8 = puVar9[uVar25];
                    } while (puVar9[uVar25] < uVar27);
LAB_001ab404:
                    iVar16 = 5;
                    if (uVar17 < uVar27) {
                      puVar9[uVar25] = uVar17;
                    }
                    else {
                      puVar9[uVar15] = uVar27;
                    }
                  }
                }
                else {
                  uVar27 = *(uint *)(lVar20 + -4 + uVar13 * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                  if ((uVar13 != 0) && (*(char *)(lVar24 + -1 + uVar13) != '\0')) {
                    do {
                      uVar17 = uVar27;
                      uVar15 = (ulong)uVar17;
                      uVar27 = UF::P_[uVar15];
                      uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
                    } while (UF::P_[uVar15] < uVar17);
                    do {
                      uVar27 = uVar8;
                      uVar25 = (ulong)uVar27;
                      uVar8 = UF::P_[uVar25];
                    } while (UF::P_[uVar25] < uVar27);
                    goto LAB_001ab217;
                  }
LAB_001ab225:
                  iVar16 = 6;
                }
              }
              else {
                uVar27 = *(uint *)(lVar22 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                do {
                  uVar17 = uVar27;
                  uVar15 = (ulong)uVar17;
                  uVar27 = UF::P_[uVar15];
                  uVar8 = *(uint *)(lVar11 + uVar13 * 4);
                } while (UF::P_[uVar15] < uVar17);
                do {
                  uVar27 = uVar8;
                  uVar25 = (ulong)uVar27;
                  uVar8 = UF::P_[uVar25];
                } while (UF::P_[uVar25] < uVar27);
LAB_001aaba5:
                if (uVar17 < uVar27) {
                  UF::P_[uVar25] = uVar17;
                }
                else {
                  UF::P_[uVar15] = uVar27;
                }
                iVar16 = 4;
              }
              goto LAB_001aad3d;
            }
LAB_001aabb7:
            uVar21 = 1;
            if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
              *(undefined4 *)(lVar20 + uVar13 * 4) = *(undefined4 *)(lVar20 + -4 + uVar13 * 4);
              uVar21 = 9;
            }
            break;
          case 4:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aac41;
            uVar21 = 4;
            if (iVar16 == 6) {
              uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              iVar16 = 6;
              if (((uVar14 != 0) && ((long)(uVar13 + 1) < lVar10)) &&
                 (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                do {
                  uVar17 = uVar27;
                  uVar15 = (ulong)uVar17;
                  uVar27 = UF::P_[uVar15];
                  uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                } while (UF::P_[uVar15] < uVar17);
                do {
                  uVar27 = uVar8;
                  uVar25 = (ulong)uVar27;
                  uVar8 = UF::P_[uVar25];
                } while (UF::P_[uVar25] < uVar27);
                goto LAB_001aaecf;
              }
            }
            else {
              if (iVar16 == 5) goto LAB_001aac88;
              if (iVar16 == 4) {
                uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                iVar16 = 6;
                if (uVar14 != 0) {
                  if (*(char *)(lVar24 + uVar13) != '\0') goto LAB_001aac30;
                  if (((long)(uVar13 + 1) < lVar10) && (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                    do {
                      uVar17 = uVar27;
                      uVar15 = (ulong)uVar17;
                      uVar27 = UF::P_[uVar15];
                      uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                    } while (UF::P_[uVar15] < uVar17);
                    do {
                      uVar27 = uVar8;
                      uVar25 = (ulong)uVar27;
                      uVar8 = UF::P_[uVar25];
                    } while (UF::P_[uVar25] < uVar27);
                    goto LAB_001ab284;
                  }
                }
                goto LAB_001aac35;
              }
            }
            goto LAB_001ab2ab;
          case 5:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aac41;
            uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
            *(uint *)(lVar1 + uVar13 * 4) = uVar27;
            if (uVar14 == 0) {
LAB_001aad48:
              iVar16 = 6;
            }
            else {
              iVar16 = 4;
              if (*(char *)(lVar24 + uVar13) == '\0') {
                if (lVar10 <= (long)(uVar13 + 1)) goto LAB_001aad48;
                iVar16 = 6;
                if (*(char *)(lVar24 + uVar13 + 1) != '\0') {
                  do {
                    uVar17 = uVar27;
                    uVar27 = UF::P_[uVar17];
                    uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                  } while (UF::P_[uVar17] < uVar17);
                  do {
                    uVar27 = uVar8;
                    uVar8 = UF::P_[uVar27];
                  } while (UF::P_[uVar27] < uVar27);
                  if (uVar17 < uVar27) {
                    UF::P_[uVar27] = uVar17;
                  }
                  else {
                    UF::P_[uVar17] = uVar27;
                  }
                  iVar16 = 5;
                }
              }
            }
            uVar21 = 4;
            goto LAB_001ab2ab;
          case 6:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aac41;
            if (iVar16 == 6) {
              uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              uVar21 = 6;
              if (((uVar14 != 0) && ((long)(uVar13 + 1) < lVar10)) &&
                 (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                do {
                  uVar17 = uVar27;
                  uVar15 = (ulong)uVar17;
                  uVar27 = UF::P_[uVar15];
                  uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                } while (UF::P_[uVar15] < uVar17);
                do {
                  uVar27 = uVar8;
                  uVar25 = (ulong)uVar27;
                  uVar8 = UF::P_[uVar25];
                } while (UF::P_[uVar25] < uVar27);
                goto LAB_001aaecf;
              }
              iVar16 = 6;
            }
            else {
              uVar21 = 6;
              if (iVar16 == 5) goto LAB_001aac88;
            }
            goto LAB_001ab2ab;
          case 7:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aabb7;
            if (uVar14 == 0) goto LAB_001aac72;
            if (*(char *)(lVar24 + uVar13) != '\0') {
              uVar27 = *(uint *)(lVar22 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              do {
                uVar17 = uVar27;
                uVar15 = (ulong)uVar17;
                uVar27 = UF::P_[uVar15];
                uVar8 = *(uint *)(lVar11 + uVar13 * 4);
              } while (UF::P_[uVar15] < uVar17);
              do {
                uVar27 = uVar8;
                uVar25 = (ulong)uVar27;
                uVar8 = UF::P_[uVar25];
              } while (UF::P_[uVar25] < uVar27);
              goto LAB_001aaba5;
            }
            if (((long)(uVar13 + 1) < lVar10) && (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
              uVar27 = *(uint *)(lVar22 + 4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              puVar9 = UF::P_;
              do {
                uVar17 = uVar27;
                uVar27 = UF::P_[uVar17];
                uVar8 = *(uint *)(lVar20 + -4 + uVar13 * 4);
              } while (UF::P_[uVar17] < uVar17);
              do {
                uVar27 = uVar8;
                uVar8 = UF::P_[uVar27];
              } while (UF::P_[uVar27] < uVar27);
              if (uVar17 < uVar27) {
                UF::P_[uVar27] = uVar17;
              }
              else {
                UF::P_[uVar17] = uVar27;
              }
              iVar16 = 5;
              if ((uVar13 != 0) && (*(char *)(lVar24 + -1 + uVar13) != '\0')) {
                uVar27 = *(uint *)(lVar1 + uVar13 * 4);
                do {
                  uVar17 = uVar27;
                  uVar15 = (ulong)uVar17;
                  uVar27 = puVar9[uVar15];
                  uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
                } while (puVar9[uVar15] < uVar17);
                do {
                  uVar27 = uVar8;
                  uVar25 = (ulong)uVar27;
                  uVar8 = puVar9[uVar25];
                } while (puVar9[uVar25] < uVar27);
                goto LAB_001ab404;
              }
            }
            else {
              uVar27 = *(uint *)(lVar20 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              if ((uVar13 == 0) || (*(char *)(lVar24 + -1 + uVar13) == '\0')) goto LAB_001ab225;
              do {
                uVar17 = uVar27;
                uVar15 = (ulong)uVar17;
                uVar27 = UF::P_[uVar15];
                uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
              } while (UF::P_[uVar15] < uVar17);
              do {
                uVar27 = uVar8;
                uVar25 = (ulong)uVar27;
                uVar8 = UF::P_[uVar25];
              } while (UF::P_[uVar25] < uVar27);
LAB_001ab217:
              iVar16 = 6;
              if (uVar17 < uVar27) {
                UF::P_[uVar25] = uVar17;
              }
              else {
                UF::P_[uVar15] = uVar27;
              }
            }
            goto LAB_001aad3d;
          case 8:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aac41;
            uVar21 = 8;
            if (iVar16 == 6) {
              uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              iVar16 = 6;
              if (((uVar14 != 0) && ((long)(uVar13 + 1) < lVar10)) &&
                 (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                do {
                  uVar17 = uVar27;
                  uVar15 = (ulong)uVar17;
                  uVar27 = UF::P_[uVar15];
                  uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                } while (UF::P_[uVar15] < uVar17);
                do {
                  uVar27 = uVar8;
                  uVar25 = (ulong)uVar27;
                  uVar8 = UF::P_[uVar25];
                } while (UF::P_[uVar25] < uVar27);
                goto LAB_001aaecf;
              }
            }
            else {
              if (iVar16 == 5) goto LAB_001aac88;
              if (iVar16 == 4) {
                uVar27 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar27;
                iVar16 = 6;
                if (uVar14 != 0) {
                  if (*(char *)(lVar24 + uVar13) != '\0') goto LAB_001aac30;
                  if (((long)(uVar13 + 1) < lVar10) && (*(char *)(lVar24 + uVar13 + 1) != '\0')) {
                    do {
                      uVar17 = uVar27;
                      uVar15 = (ulong)uVar17;
                      uVar27 = UF::P_[uVar15];
                      uVar8 = *(uint *)(lVar22 + 4 + uVar13 * 4);
                    } while (UF::P_[uVar15] < uVar17);
                    do {
                      uVar27 = uVar8;
                      uVar25 = (ulong)uVar27;
                      uVar8 = UF::P_[uVar25];
                    } while (UF::P_[uVar25] < uVar27);
                    goto LAB_001ab284;
                  }
                }
                goto LAB_001aac35;
              }
            }
            goto LAB_001ab2ab;
          case 9:
            if (*(char *)(lVar26 + uVar13) == '\0') goto LAB_001aabb7;
            if (uVar14 == 0) goto LAB_001aac72;
            if (*(char *)(lVar24 + uVar13) != '\0') {
              uVar27 = *(uint *)(lVar22 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              do {
                uVar17 = uVar27;
                uVar15 = (ulong)uVar17;
                uVar27 = UF::P_[uVar15];
                uVar8 = *(uint *)(lVar11 + uVar13 * 4);
              } while (UF::P_[uVar15] < uVar17);
              do {
                uVar27 = uVar8;
                uVar25 = (ulong)uVar27;
                uVar8 = UF::P_[uVar25];
              } while (UF::P_[uVar25] < uVar27);
              goto LAB_001aaba5;
            }
            if ((lVar10 <= (long)(uVar13 + 1)) || (*(char *)(lVar24 + uVar13 + 1) == '\0')) {
              lVar12 = uVar13 - 1;
              uVar27 = *(uint *)(lVar20 + lVar12 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              if ((uVar13 == 0) || (*(char *)(lVar24 + lVar12) == '\0')) goto LAB_001ab225;
              do {
                uVar17 = uVar27;
                uVar15 = (ulong)uVar17;
                uVar27 = UF::P_[uVar15];
                uVar8 = *(uint *)(lVar22 + lVar12 * 4);
              } while (UF::P_[uVar15] < uVar17);
              do {
                uVar27 = uVar8;
                uVar25 = (ulong)uVar27;
                uVar8 = UF::P_[uVar25];
              } while (UF::P_[uVar25] < uVar27);
              goto LAB_001ab217;
            }
            uVar27 = *(uint *)(lVar22 + 4 + uVar13 * 4);
            *(uint *)(lVar1 + uVar13 * 4) = uVar27;
            puVar9 = UF::P_;
            do {
              uVar17 = uVar27;
              uVar27 = UF::P_[uVar17];
              uVar8 = *(uint *)(lVar20 + -4 + uVar13 * 4);
            } while (UF::P_[uVar17] < uVar17);
            do {
              uVar27 = uVar8;
              uVar8 = UF::P_[uVar27];
            } while (UF::P_[uVar27] < uVar27);
            if (uVar17 < uVar27) {
              UF::P_[uVar27] = uVar17;
            }
            else {
              UF::P_[uVar17] = uVar27;
            }
            iVar16 = 5;
            if ((uVar13 != 0) && (*(char *)(lVar24 + -1 + uVar13) != '\0')) {
              uVar27 = *(uint *)(lVar1 + uVar13 * 4);
              do {
                uVar17 = uVar27;
                uVar15 = (ulong)uVar17;
                uVar27 = puVar9[uVar15];
                uVar8 = *(uint *)(lVar22 + -4 + uVar13 * 4);
              } while (puVar9[uVar15] < uVar17);
              do {
                uVar27 = uVar8;
                uVar25 = (ulong)uVar27;
                uVar8 = puVar9[uVar25];
              } while (puVar9[uVar25] < uVar27);
              goto LAB_001ab404;
            }
LAB_001aad3d:
            uVar21 = 8;
LAB_001ab2ab:
            if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
              *(undefined4 *)(lVar20 + uVar13 * 4) = *(undefined4 *)(lVar1 + uVar13 * 4);
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar26 + uVar13) == '\0') {
              uVar21 = 1;
              if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
                UF::P_[UF::length_] = UF::length_;
                uVar27 = UF::length_ + 1;
                *(uint *)(lVar20 + uVar13 * 4) = UF::length_;
                UF::length_ = uVar27;
LAB_001aac67:
                uVar21 = 7;
              }
            }
            else {
              if (uVar14 == 0) {
LAB_001aaf02:
                UF::P_[UF::length_] = UF::length_;
                iVar16 = 6;
                uVar27 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else if (*(char *)(lVar24 + uVar13) == '\0') {
                if ((lVar10 <= (long)(uVar13 + 1)) || (*(char *)(lVar24 + uVar13 + 1) == '\0'))
                goto LAB_001aaf02;
                iVar16 = 5;
                uVar27 = *(uint *)(lVar22 + 4 + uVar13 * 4);
              }
              else {
                iVar16 = 4;
                uVar27 = *(uint *)(lVar22 + uVar13 * 4);
              }
              *(uint *)(lVar1 + uVar13 * 4) = uVar27;
              uVar21 = 2;
              if ((uVar23 < uVar19) && (*(char *)(lVar28 + uVar13) != '\0')) {
                *(uint *)(lVar20 + uVar13 * 4) = uVar27;
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar18);
      }
      puVar9 = UF::P_;
      uVar14 = uVar14 + 2;
    } while (uVar14 < uVar19);
    if (UF::length_ < 2) {
      uVar18 = 1;
    }
    else {
      uVar18 = 1;
      uVar19 = 1;
      do {
        if (puVar9[uVar19] < uVar19) {
          uVar27 = puVar9[puVar9[uVar19]];
        }
        else {
          uVar27 = uVar18;
          uVar18 = uVar18 + 1;
        }
        puVar9[uVar19] = uVar27;
        uVar19 = uVar19 + 1;
      } while (uVar19 < UF::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar18;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar16 = *(int *)&pMVar5->field_0x8;
  if (0 < iVar16) {
    lVar10 = *(long *)&pMVar5->field_0x10;
    lVar1 = **(long **)&pMVar5->field_0x48;
    lVar20 = 0;
    do {
      iVar2 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar2 != 0) {
        lVar28 = 0;
        do {
          *(uint *)(lVar10 + lVar28) = puVar9[*(uint *)(lVar10 + lVar28)];
          lVar28 = lVar28 + 4;
        } while ((long)iVar2 * 4 != lVar28);
        iVar16 = *(int *)&pMVar5->field_0x8;
      }
      lVar20 = lVar20 + 1;
      lVar10 = lVar10 + lVar1;
    } while (lVar20 < iVar16);
  }
  if (puVar9 != (uint *)0x0) {
    operator_delete__(puVar9);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }